

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trace_geodesic.cpp
# Opt level: O3

TraceSubResult *
geometrycentral::surface::anon_unknown_2::traceInFaceBarycentric
          (TraceSubResult *__return_storage_ptr__,IntrinsicGeometryInterface *geom,Face face,
          Vector3 startPoint,Vector3 vecBary,Vector2 vecCartesianDir,double vecCartesianLen,
          array<bool,_3UL> edgeIsHittable,TraceOptions *traceOptions)

{
  _func_int ***ppp_Var1;
  pointer puVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  size_t i_1;
  ParentMeshT *pPVar8;
  TraceSubResult *pTVar9;
  runtime_error *this;
  size_t sVar10;
  long lVar11;
  ParentMeshT *pPVar12;
  long lVar13;
  ulong uVar14;
  code *pcVar15;
  ulong uVar16;
  ulong uVar17;
  undefined *puVar18;
  ulong uVar19;
  ulong uVar20;
  size_t i;
  ulong uVar21;
  double dVar22;
  double dVar23;
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [64];
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  long in_stack_00000038;
  undefined2 local_8c;
  undefined1 local_8a;
  double local_88 [4];
  double local_68 [2];
  _func_int **local_58;
  SurfaceMesh *pSStack_50;
  undefined1 local_48 [16];
  
  auVar25._8_56_ = vecCartesianDir._16_56_;
  auVar25._0_8_ = vecCartesianDir.y;
  auVar24._8_56_ = vecCartesianDir._8_56_;
  auVar24._0_8_ = vecCartesianDir.x;
  sVar10 = face.super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>
           .ind;
  pPVar12 = face.
            super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.
            mesh;
  local_8c = edgeIsHittable._M_elems._0_2_;
  local_8a = edgeIsHittable._M_elems[2];
  local_68[0] = 0.0;
  local_68[1] = 0.0;
  uVar14 = (pPVar12->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start[sVar10];
  ppp_Var1 = &(geom->super_BaseGeometryInterface)._vptr_BaseGeometryInterface + uVar14 * 2;
  local_58 = *ppp_Var1;
  pSStack_50 = (SurfaceMesh *)ppp_Var1[1];
  puVar2 = (pPVar12->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  auVar3._8_8_ = 0x8000000000000000;
  auVar3._0_8_ = 0x8000000000000000;
  local_48 = vxorpd_avx512vl(*(undefined1 (*) [16])
                              (&(geom->super_BaseGeometryInterface)._vptr_BaseGeometryInterface +
                              puVar2[puVar2[uVar14]] * 2),auVar3);
  if ((startPoint.x + startPoint.y + startPoint.z < 0.5) && (((ulong)traceOptions & 1) != 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(this,"bad bary point");
LAB_001b25dd:
    puVar18 = &::std::runtime_error::typeinfo;
    pcVar15 = ::std::runtime_error::~runtime_error;
LAB_001b25eb:
    __cxa_throw(this,puVar18,pcVar15);
  }
  auVar30._0_8_ = startPoint.x + vecBary.x;
  auVar30._8_8_ = startPoint.y + vecBary.y;
  if (((0.0 <= auVar30._0_8_) && (auVar3 = vshufpd_avx(auVar30,auVar30,1), 0.0 <= auVar3._0_8_)) &&
     (dVar33 = startPoint.z + vecBary.z, 0.0 <= dVar33)) {
    startPoint.z = NAN;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    __return_storage_ptr__->terminated = true;
    (__return_storage_ptr__->endPoint).type = Face;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).tEdge = NAN;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPVar12;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         sVar10;
    (__return_storage_ptr__->endPoint).faceCoords.x = auVar30._0_8_;
    (__return_storage_ptr__->endPoint).faceCoords.y = auVar30._8_8_;
    (__return_storage_ptr__->endPoint).faceCoords.z = dVar33;
LAB_001b23b3:
    (__return_storage_ptr__->incomingDirToPoint).x = auVar24._0_8_;
    (__return_storage_ptr__->incomingDirToPoint).y = auVar25._0_8_;
    return (TraceSubResult *)startPoint.z;
  }
  auVar32 = ZEXT1664(ZEXT816(0x7ff0000000000000));
  uVar17 = 0xffffffffffffffff;
  uVar20 = 0xfffffcf7;
  pPVar8 = (ParentMeshT *)0x0;
  uVar19 = 0;
  do {
    uVar21 = uVar19 + 1;
    uVar14 = puVar2[uVar14];
    uVar16 = 0;
    if (uVar19 != 2) {
      uVar16 = uVar21;
    }
    if (((*(char *)((long)&local_8c + uVar16) == '\x01') && ((&vecBary.x)[uVar19] < 0.0)) &&
       (dVar33 = -(&startPoint.x)[uVar19] / (&vecBary.x)[uVar19], dVar33 < auVar32._0_8_)) {
      uVar20 = uVar19 & 0xffffffff;
      auVar32 = ZEXT1664(CONCAT88(0x8000000000000000,dVar33));
      pPVar8 = pPVar12;
      uVar17 = uVar14;
    }
    uVar19 = uVar21;
  } while (uVar21 != 3);
  if (uVar17 == 0xffffffffffffffff) {
    if (((ulong)traceOptions & 1) == 0) {
      (__return_storage_ptr__->crossHe).
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh
           = (ParentMeshT *)0x0;
      (__return_storage_ptr__->crossHe).
      super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      __return_storage_ptr__->terminated = true;
      (__return_storage_ptr__->endPoint).type = Face;
      (__return_storage_ptr__->endPoint).vertex.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      (__return_storage_ptr__->endPoint).vertex.
      super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).edge.
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
           (ParentMeshT *)0x0;
      (__return_storage_ptr__->endPoint).edge.
      super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
           0xffffffffffffffff;
      (__return_storage_ptr__->endPoint).tEdge = NAN;
      (__return_storage_ptr__->endPoint).face.
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
           pPVar12;
      (__return_storage_ptr__->endPoint).face.
      super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
           sVar10;
      (__return_storage_ptr__->endPoint).faceCoords.x = startPoint.x;
      (__return_storage_ptr__->endPoint).faceCoords.y = startPoint.y;
      (__return_storage_ptr__->endPoint).faceCoords.z = startPoint.z;
      goto LAB_001b23b3;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::logic_error::logic_error
              ((logic_error *)this,"no halfedge intersection was selected, precondition problem?");
    puVar18 = &::std::logic_error::typeinfo;
    pcVar15 = ::std::logic_error::~logic_error;
    goto LAB_001b25eb;
  }
  iVar7 = (int)uVar20;
  auVar3 = vmaxsd_avx(ZEXT816(0),auVar32._0_16_);
  uVar4 = vcmpsd_avx512f(ZEXT816(0x3fefffffff768fa1),auVar32._0_16_,1);
  bVar5 = (bool)((byte)uVar4 & 1);
  dVar22 = (double)((ulong)bVar5 * 0x3fefffffff768fa1 + (ulong)!bVar5 * auVar3._0_8_);
  lVar11 = (long)(iVar7 + 2 + ((iVar7 + 2) / 3) * -3);
  lVar13 = (long)(iVar7 + 1 + ((iVar7 + 1) / 3) * -3);
  local_88[0] = startPoint.x + dVar22 * vecBary.x;
  local_88[1] = startPoint.y + dVar22 * vecBary.y;
  local_88[2] = startPoint.z + vecBary.z * dVar22;
  dVar33 = local_88[lVar11];
  dVar23 = local_68[lVar11 * 2 + 1] - local_68[lVar13 * 2 + 1];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = local_68[lVar11 * 2] - local_68[lVar13 * 2];
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar23 * dVar23;
  auVar3 = vfmadd231sd_fma(auVar35,auVar27,auVar27);
  auVar3 = vsqrtsd_avx(auVar3,auVar3);
  dVar34 = 1.0 / auVar3._0_8_;
  dVar23 = dVar23 * dVar34;
  dVar34 = dVar34 * (local_68[lVar11 * 2] - local_68[lVar13 * 2]);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar34;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar23 * dVar23;
  auVar3 = vfmadd231sd_fma(auVar36,auVar28,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = dVar34;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar23 * auVar24._0_8_;
  auVar27 = vfmsub231sd_fma(auVar31,auVar25._0_16_,auVar29);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = dVar23 * auVar25._0_8_;
  auVar30 = vfmadd231sd_fma(auVar37,auVar24._0_16_,auVar29);
  dVar34 = 1.0 / auVar3._0_8_;
  dVar23 = auVar30._0_8_ * dVar34;
  dVar34 = auVar27._0_8_ * dVar34;
  if (((0x7fefffffffffffff < (long)ABS(dVar23)) || (0x7fefffffffffffff < (long)ABS(dVar34))) &&
     (((ulong)traceOptions & 1) != 0)) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this,"bad value transforming to new edge. is there a zero-length edge?");
    goto LAB_001b25dd;
  }
  auVar26._0_8_ = dVar33 / (dVar33 + local_88[lVar13]);
  auVar26._8_8_ = dVar33;
  bVar5 = pPVar8->useImplicitTwinFlag;
  uVar4 = vcmpsd_avx512f(ZEXT816(0x3ff0000000000000),auVar26,1);
  bVar6 = (bool)((byte)uVar4 & 1);
  auVar3 = vmaxsd_avx(ZEXT816(0),auVar26);
  dVar33 = (double)((ulong)bVar6 * 0x3ff0000000000000 + (ulong)!bVar6 * auVar3._0_8_);
  if (bVar5 == true) {
    uVar14 = uVar17 ^ 1;
  }
  else {
    uVar14 = (pPVar8->heSiblingArr).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar17];
  }
  if ((pPVar8->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar14] < pPVar8->nFacesFillCount) {
    if (in_stack_00000038 != 0) {
      if (bVar5 == false) {
        uVar14 = (pPVar8->heEdgeArr).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar17];
      }
      else {
        uVar14 = uVar17 >> 1;
      }
      if (*(char *)(*(long *)(in_stack_00000038 + 0x10) + uVar14) == '\x01') goto LAB_001b2412;
    }
    (__return_storage_ptr__->endPoint).type = Vertex;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).tEdge = NAN;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.y = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.z = NAN;
    __return_storage_ptr__->terminated = false;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPVar8;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         uVar17;
    __return_storage_ptr__->tCross = dVar33;
    (__return_storage_ptr__->traceVectorInHalfedgeDir).x = dVar23;
    dVar33 = (1.0 - dVar22) * vecCartesianLen;
    pTVar9 = (TraceSubResult *)0x30;
    lVar11 = 0x28;
    dVar23 = dVar34;
  }
  else {
LAB_001b2412:
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->crossHe).
    super_Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).tEdge = NAN;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.y = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.z = NAN;
    __return_storage_ptr__->terminated = true;
    if (bVar5 == false) {
      uVar14 = (pPVar8->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar17];
      uVar19 = (pPVar8->eHalfedgeArr).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14];
    }
    else {
      uVar14 = uVar17 >> 1;
      uVar19 = uVar17 & 0xfffffffffffffffe;
    }
    (__return_storage_ptr__->endPoint).type = Edge;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).vertex.
    super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         pPVar8;
    (__return_storage_ptr__->endPoint).edge.
    super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         uVar14;
    pTVar9 = (TraceSubResult *)0x98;
    lVar11 = 0x90;
    (__return_storage_ptr__->endPoint).tEdge =
         (double)((ulong)(uVar19 == uVar17) * (long)dVar33 +
                 (ulong)(uVar19 != uVar17) * (long)(1.0 - dVar33));
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.mesh =
         (ParentMeshT *)0x0;
    (__return_storage_ptr__->endPoint).face.
    super_Element<geometrycentral::surface::Face,_geometrycentral::surface::SurfaceMesh>.ind =
         0xffffffffffffffff;
    (__return_storage_ptr__->endPoint).faceCoords.x = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.y = NAN;
    (__return_storage_ptr__->endPoint).faceCoords.z = NAN;
    dVar33 = dVar34;
  }
  *(double *)(&__return_storage_ptr__->terminated + lVar11) = dVar23;
  *(double *)(&pTVar9->terminated + (long)&__return_storage_ptr__->terminated) = dVar33;
  return pTVar9;
}

Assistant:

inline TraceSubResult traceInFaceBarycentric(IntrinsicGeometryInterface& geom, Face face, Vector3 startPoint,
                                             Vector3 vecBary, Vector2 vecCartesianDir, double vecCartesianLen,
                                             std::array<bool, 3> edgeIsHittable, const TraceOptions& traceOptions) {

  // Gather values
  std::array<Vector2, 3> vertexCoords = vertexCoordinatesInTriangle(geom, face);
  Vector3 triangleLengths{geom.edgeLengths[face.halfedge().edge()], geom.edgeLengths[face.halfedge().next().edge()],
                          geom.edgeLengths[face.halfedge().next().next().edge()]};

  if (sum(startPoint) < 0.5) {
    if (TRACE_PRINT) {
      cout << "  bad bary point: " << startPoint << endl;
    }
    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("bad bary point");
    }
  }

  if (TRACE_PRINT) {
    cout << "  general trace in face: " << endl;
    cout << "  face: " << face << " startPoint " << startPoint << " vecBary = " << vecBary << " vecCartesian "
         << vecCartesianDir << " " << vecCartesianLen << endl;
  }

  if (TRACE_PRINT) {
    cout << "  vec bary  = " << vecBary << endl;
    cout << "  reconvert = " << cartesianVectorToBarycentric(vertexCoords, vecCartesianDir) * vecCartesianLen << endl;
  }

  // Test if the vector ends in the triangle
  Vector3 endPoint = startPoint + vecBary;
  if (TRACE_PRINT) {
    cout << "    endpoint: " << endPoint << endl;
  }

  /*
  if (isInsideTriangle(endPoint)) {
    // Fancy test if ending on edges
    // (to detect when we're within eps of edge)
    bool foundEpsEdge = false;
    if (traceOptions.allowEndOnEdge) {
      double A = 0.5 * cross(vertexCoords[1] - vertexCoords[0], vertexCoords[2] - vertexCoords[0]);
      Halfedge endHe = face.halfedge();
      for (int i = 0; i < 3; i++) {
        double dist = 2. * endPoint[i] * A / triangleLengths[i]; // perp distance to edge
        if (endPoint[i] > 0 && dist < traceOptions.allowEndOnEdgeEps) {
          // force the process below to hit this edge, let other logic proceed
          edgeIsHittable[i] = true;
          edgeIsHittable[(i + 1) % 3] = false;
          edgeIsHittable[(i + 2) % 3] = false;
          foundEpsEdge = true;
          break;
        }
      }
    }
    // Simple test if not ending on edges
    if (!foundEpsEdge) {
      // The trace ended! Call it a day.
      TraceSubResult result;
      result.terminated = true;
      result.endPoint = SurfacePoint(face, endPoint);
      result.incomingDirToPoint = vecCartesian;
      return result;
    }
  }
  */

  if (isInsideTriangle(endPoint)) {
    // The trace ended! Call it a day.
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(face, endPoint);
    result.incomingDirToPoint = vecCartesianDir;
    return result;
  }


  // The vector did not end in this triangle. Pick an appropriate point along some edge
  double tRay = std::numeric_limits<double>::infinity();
  Halfedge crossHe = Halfedge();
  int iOppVertEnd = -777;
  Halfedge currHe = face.halfedge();
  for (int i = 0; i < 3; i++) {
    currHe = currHe.next(); // always opposite the i'th vertex

    // Check the crossing
    double tRayThisRaw = -startPoint[i] / vecBary[i];
    double tRayThis = clamp(tRayThisRaw, 0., 1. - TRACE_EPS_LOOSE);

    if (TRACE_PRINT) {
      cout << "    considering intersection:" << endl;
      cout << std::boolalpha;
      cout << "      hittable[(i+1)%3]: " << edgeIsHittable[(i + 1) % 3] << endl;
      cout << "      vecBary[i]: " << vecBary[i] << endl;
      cout << "      startPoint[i]: " << startPoint[i] << endl;
      cout << "      tRayThisRaw: " << tRayThisRaw << endl;
      cout << "      tRayThis: " << tRayThis << endl;
    }


    if (!edgeIsHittable[(i + 1) % 3] || vecBary[i] >= 0) {
      // note should ALWAYS satisfy precondition that vecBary[i] is negative for at least one hittable edge.
      // if not, fix projection of inputs in caller
      continue;
    }

    if (tRayThisRaw < tRay) {
      // This is the new closest intersection
      tRay = tRayThisRaw;
      crossHe = currHe;
      iOppVertEnd = i;
    }
  }

  if (TRACE_PRINT) {
    cout << "    selected intersection:" << endl;
    cout << "      crossHe: " << crossHe << endl;
    cout << "      tRay: " << tRay << endl;
    cout << "      iOppVertEnd: " << iOppVertEnd << endl;
  }

  // Clamp to a sane range
  tRay = clamp(tRay, 0., 1. - TRACE_EPS_LOOSE);


  if (crossHe == Halfedge()) {
    if (traceOptions.errorOnProblem) {
      throw std::logic_error("no halfedge intersection was selected, precondition problem?");
    }
    if (TRACE_PRINT) {
      cout << "    PROBLEM PROBLEM NO INTERSECTION:" << endl;
    }

    // End immediately
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(face, startPoint);
    result.incomingDirToPoint = vecCartesianDir;
    return result;
  }

  // Compute some useful info about the endpoint
  Vector3 endPointOnEdge = startPoint + tRay * vecBary;
  double tCross = endPointOnEdge[(iOppVertEnd + 2) % 3] /
                  (endPointOnEdge[(iOppVertEnd + 1) % 3] + endPointOnEdge[(iOppVertEnd + 2) % 3]);
  if (TRACE_PRINT) {
    cout << "    end point on edge: " << endPointOnEdge << endl;
    cout << "    tCross raw: " << tCross << endl;
  }
  tCross = clamp(tCross, 0., 1.);

  // Rotate the vector in to the frame of crossHe and shorten it
  double lenRemaining = (1.0 - tRay) * vecCartesianLen;
  Vector2 crossingEdgeVec = (vertexCoords[(iOppVertEnd + 2) % 3] - vertexCoords[(iOppVertEnd + 1) % 3]);
  Vector2 remainingDirInHalfedge = vecCartesianDir / crossingEdgeVec.normalize();
  if (!isfinite(remainingDirInHalfedge)) {
    if (TRACE_PRINT) {
      cout << "    NON FINITE REMAINING TRACE" << endl;
      cout << "    lenRemaining = " << lenRemaining << endl;
      cout << "    crossingEdgeVec = " << crossingEdgeVec << endl;
      cout << "    remainingDirInHalfedge = " << remainingDirInHalfedge << endl;
    }

    if (traceOptions.errorOnProblem) {
      throw std::runtime_error("bad value transforming to new edge. is there a zero-length edge?");
    }
  }


  // Stop tracing if we hit a boundary
  if (!crossHe.twin().isInterior() || (traceOptions.barrierEdges && (*traceOptions.barrierEdges)[crossHe.edge()])) {
    // Build the result
    TraceSubResult result;
    result.terminated = true;
    result.endPoint = SurfacePoint(crossHe.edge(), convertTToEdge(crossHe, tCross));
    result.incomingDirToPoint = remainingDirInHalfedge;

    return result;
  }

  // Build the result
  TraceSubResult result;
  result.terminated = false;
  result.crossHe = crossHe;
  result.tCross = tCross;
  result.traceVectorInHalfedgeDir = remainingDirInHalfedge;
  result.traceVectorInHalfedgeLen = lenRemaining;
  return result;
}